

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strparse.c
# Opt level: O2

int Curl_str_cspn(char **linep,Curl_str *out,char *reject)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  
  __s = *linep;
  sVar2 = strcspn(__s,reject);
  if (sVar2 == 0) {
    out->str = (char *)0x0;
    out->len = 0;
    iVar1 = 2;
  }
  else {
    out->str = __s;
    out->len = sVar2;
    *linep = __s + sVar2;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int Curl_str_cspn(const char **linep, struct Curl_str *out, const char *reject)
{
  const char *s = *linep;
  size_t len;
  DEBUGASSERT(linep && *linep);

  len = strcspn(s, reject);
  if(len) {
    out->str = s;
    out->len = len;
    *linep = &s[len];
    return STRE_OK;
  }
  Curl_str_init(out);
  return STRE_SHORT;
}